

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Result __thiscall
testing::Action<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::Perform
          (Action<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,ArgumentTuple *args
          )

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  ActionInterface<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *pAVar4;
  undefined4 extraout_var;
  undefined8 in_RSI;
  linked_ptr<testing::ActionInterface<__locale_struct_*(int,_const_char_*,___locale_struct_*)>_>
  *in_RDI;
  string *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  allocator *paVar5;
  allocator local_31;
  string local_30 [32];
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = IsDoDefault((Action<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)0x13934d);
  uVar2 = !bVar1;
  paVar5 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,paVar5);
  internal::Assert(SUB81((ulong)paVar5 >> 0x38,0),(char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                   (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pAVar4 = internal::
           linked_ptr<testing::ActionInterface<__locale_struct_*(int,_const_char_*,___locale_struct_*)>_>
           ::operator->(in_RDI);
  iVar3 = (*pAVar4->_vptr_ActionInterface[2])(pAVar4,local_10);
  return (Result)CONCAT44(extraout_var,iVar3);
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }